

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O0

void on_body_until_close(h2o_socket_t *sock,char *err)

{
  st_h2o_http1client_private_t *client_00;
  h2o_http1client_head_cb p_Var1;
  size_t *in_RCX;
  h2o_iovec_t **extraout_RDX;
  int *in_R8;
  st_h2o_http1client_private_t *client;
  char *err_local;
  h2o_socket_t *sock_local;
  
  client_00 = (st_h2o_http1client_private_t *)sock->data;
  h2o_timeout_unlink(&client_00->_timeout);
  if (err == (char *)0x0) {
    if ((sock->bytes_read == 0) ||
       (p_Var1 = (*(client_00->_cb).on_connect)
                           ((h2o_http1client_t *)client_00,(char *)0x0,extraout_RDX,(size_t *)0x0,
                            in_R8), (int)p_Var1 == 0)) {
      h2o_timeout_link(((client_00->super).ctx)->loop,((client_00->super).ctx)->io_timeout,
                       &client_00->_timeout);
    }
    else {
      close_client(client_00);
    }
  }
  else {
    (*(client_00->_cb).on_connect)
              ((h2o_http1client_t *)client_00,"end of stream",extraout_RDX,in_RCX,in_R8);
    close_client(client_00);
  }
  return;
}

Assistant:

static void on_body_until_close(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;

    h2o_timeout_unlink(&client->_timeout);

    if (err != NULL) {
        client->_cb.on_body(&client->super, h2o_http1client_error_is_eos);
        close_client(client);
        return;
    }

    if (sock->bytes_read != 0) {
        if (client->_cb.on_body(&client->super, NULL) != 0) {
            close_client(client);
            return;
        }
    }

    h2o_timeout_link(client->super.ctx->loop, client->super.ctx->io_timeout, &client->_timeout);
}